

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

float __thiscall chaiscript::Boxed_Number::get_as<float>(Boxed_Number *this)

{
  Common_Types CVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  float fVar5;
  
  CVar1 = get_common_type(&this->bv);
  switch(CVar1) {
  case t_int32:
    fVar5 = (float)*((this->bv).m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_const_data_ptr;
    break;
  case t_double:
    fVar5 = (float)*((this->bv).m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_const_data_ptr;
    break;
  case t_uint8:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    goto LAB_002a32bb;
  case t_int8:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    goto LAB_002a32bb;
  case t_uint16:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
    goto LAB_002a32bb;
  case t_int16:
    uVar2 = (uint)*((this->bv).m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_const_data_ptr;
LAB_002a32bb:
    fVar5 = (float)(int)uVar2;
    break;
  case t_uint32:
    uVar3 = (ulong)*((this->bv).m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_const_data_ptr;
    goto LAB_002a32ca;
  case t_uint64:
    uVar3 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    if ((long)uVar3 < 0) {
      return (float)uVar3;
    }
LAB_002a32ca:
    fVar5 = (float)(long)uVar3;
    break;
  case t_int64:
    fVar5 = (float)*((this->bv).m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_const_data_ptr;
    break;
  case t_float:
    fVar5 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_long_double:
    fVar5 = (float)*((this->bv).m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_const_data_ptr;
    break;
  default:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__bad_cast_003c7d48;
    __cxa_throw(puVar4,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return fVar5;
}

Assistant:

Target get_as() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }